

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

string * ListQt5RccInputs(string *__return_storage_ptr__,cmSourceFile *sf,cmGeneratorTarget *target,
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *depends)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  string *psVar4;
  istream *piVar5;
  ostream *poVar6;
  char *pcVar7;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  qrcEntries;
  string rccStdOut;
  string oline;
  string absFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string rccStdErr;
  string rccCommand;
  string local_1d0;
  string rccStdOut_1;
  
  GetRccExecutable_abi_cxx11_(&rccCommand,target);
  rccStdOut._M_dataplus._M_p = (pointer)0x0;
  rccStdOut._M_string_length = 0;
  rccStdOut.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&rccStdOut,&rccCommand);
  std::__cxx11::string::string((string *)&rccStdOut_1,"--help",(allocator *)&absFile);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&rccStdOut,
             &rccStdOut_1);
  std::__cxx11::string::~string((string *)&rccStdOut_1);
  rccStdOut_1._M_dataplus._M_p = (pointer)&rccStdOut_1.field_2;
  rccStdOut_1._M_string_length = 0;
  rccStdOut_1.field_2._M_local_buf[0] = '\0';
  absFile._M_dataplus._M_p = (pointer)&absFile.field_2;
  absFile._M_string_length = 0;
  absFile.field_2._M_local_buf[0] = '\0';
  rccStdErr._M_dataplus._M_p = (pointer)((ulong)rccStdErr._M_dataplus._M_p._4_4_ << 0x20);
  bVar1 = cmSystemTools::RunSingleCommand
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&rccStdOut,&rccStdOut_1,&absFile,(int *)&rccStdErr,(char *)0x0,OUTPUT_NONE,
                     0.0);
  if (bVar1 && (int)rccStdErr._M_dataplus._M_p == 0) {
    lVar3 = std::__cxx11::string::find((char *)&rccStdOut_1,0x542bd5);
    pcVar7 = "-list";
    if (lVar3 != -1) {
      pcVar7 = "--list";
    }
  }
  else {
    pcVar7 = "-list";
  }
  std::__cxx11::string::~string((string *)&absFile);
  std::__cxx11::string::~string((string *)&rccStdOut_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&rccStdOut);
  qrcEntries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  qrcEntries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  qrcEntries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&command,&rccCommand);
  std::__cxx11::string::string((string *)&rccStdOut_1,pcVar7,(allocator *)&absFile);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
             &rccStdOut_1);
  std::__cxx11::string::~string((string *)&rccStdOut_1);
  psVar4 = cmSourceFile::GetFullPath(sf,(string *)0x0);
  cmsys::SystemTools::GetRealPath(&absFile,psVar4,(string *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&command,&absFile);
  rccStdOut._M_dataplus._M_p = (pointer)&rccStdOut.field_2;
  rccStdOut._M_string_length = 0;
  rccStdOut.field_2._M_allocated_capacity =
       rccStdOut.field_2._M_allocated_capacity & 0xffffffffffffff00;
  rccStdErr._M_dataplus._M_p = (pointer)&rccStdErr.field_2;
  rccStdErr._M_string_length = 0;
  rccStdErr.field_2._M_local_buf[0] = '\0';
  retVal = 0;
  bVar1 = cmSystemTools::RunSingleCommand
                    (&command,&rccStdOut,&rccStdErr,&retVal,(char *)0x0,OUTPUT_NONE,0.0);
  if (bVar1 && retVal == 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&rccStdOut_1,(string *)&rccStdOut,_S_in);
    oline._M_string_length = 0;
    oline.field_2._M_local_buf[0] = '\0';
    oline._M_dataplus._M_p = (pointer)&oline.field_2;
    while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&rccStdOut_1,(string *)&oline),
          ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
      cmQtAutoGeneratorsStripCR(&local_1d0,&oline);
      std::__cxx11::string::operator=((string *)&oline,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      if (oline._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&qrcEntries,&oline);
      }
    }
    std::__cxx11::string::~string((string *)&oline);
    std::__cxx11::istringstream::~istringstream((istringstream *)&rccStdOut_1);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&rccStdOut_1,(string *)&rccStdErr,_S_in);
    oline._M_string_length = 0;
    oline.field_2._M_local_buf[0] = '\0';
    oline._M_dataplus._M_p = (pointer)&oline.field_2;
    while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&rccStdOut_1,(string *)&oline),
          ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
      cmQtAutoGeneratorsStripCR(&local_1d0,&oline);
      std::__cxx11::string::operator=((string *)&oline,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,14ul>(&oline,(char (*) [14])"RCC: Error in");
      if (bVar1) {
        if ((ListQt5RccInputs(cmSourceFile*,cmGeneratorTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
             ::searchString_abi_cxx11_ == '\0') &&
           (iVar2 = __cxa_guard_acquire(&ListQt5RccInputs(cmSourceFile*,cmGeneratorTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                         ::searchString_abi_cxx11_), iVar2 != 0)) {
          std::__cxx11::string::string
                    ((string *)
                     &ListQt5RccInputs(cmSourceFile*,cmGeneratorTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                      ::searchString_abi_cxx11_,"Cannot find file \'",(allocator *)&local_1d0);
          __cxa_atexit(std::__cxx11::string::~string,
                       &ListQt5RccInputs(cmSourceFile*,cmGeneratorTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                        ::searchString_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&ListQt5RccInputs(cmSourceFile*,cmGeneratorTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::searchString_abi_cxx11_);
        }
        lVar3 = std::__cxx11::string::find((string *)&oline,0x6958a0);
        if (lVar3 == -1) {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "AUTOGEN: error: Rcc lists unparsable output ");
          poVar6 = std::operator<<(poVar6,(string *)&oline);
          std::endl<char,std::char_traits<char>>(poVar6);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::string::~string((string *)&oline);
          std::__cxx11::istringstream::~istringstream((istringstream *)&rccStdOut_1);
          goto LAB_00351dd9;
        }
        std::__cxx11::string::substr((ulong)&local_1d0,(ulong)&oline);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&qrcEntries,
                   &local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
      }
    }
    std::__cxx11::string::~string((string *)&oline);
    std::__cxx11::istringstream::~istringstream((istringstream *)&rccStdOut_1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)depends,
               (depends->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )qrcEntries.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )qrcEntries.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (__return_storage_ptr__,&qrcEntries,"@list_sep@");
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: error: Rcc list process for ");
    psVar4 = cmSourceFile::GetFullPath(sf,(string *)0x0);
    poVar6 = std::operator<<(poVar6,(string *)psVar4);
    poVar6 = std::operator<<(poVar6," failed:\n");
    poVar6 = std::operator<<(poVar6,(string *)&rccStdOut);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,(string *)&rccStdErr);
    std::endl<char,std::char_traits<char>>(poVar6);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
LAB_00351dd9:
  std::__cxx11::string::~string((string *)&rccStdErr);
  std::__cxx11::string::~string((string *)&rccStdOut);
  std::__cxx11::string::~string((string *)&absFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&command);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&qrcEntries);
  std::__cxx11::string::~string((string *)&rccCommand);
  return __return_storage_ptr__;
}

Assistant:

static std::string ListQt5RccInputs(cmSourceFile* sf,
                                            cmGeneratorTarget const* target,
                                            std::vector<std::string>& depends)
{
  std::string rccCommand
      = GetRccExecutable(target);

  bool hasDashDashList = false;
  {
  std::vector<std::string> command;
  command.push_back(rccCommand);
  command.push_back("--help");
  std::string rccStdOut;
  std::string rccStdErr;
  int retVal = 0;
  bool result = cmSystemTools::RunSingleCommand(
    command, &rccStdOut, &rccStdErr,
    &retVal, 0, cmSystemTools::OUTPUT_NONE);
  if (result && retVal == 0 &&
      rccStdOut.find("--list") != std::string::npos)
    {
    hasDashDashList = true;
    }
  }

  std::vector<std::string> qrcEntries;

  std::vector<std::string> command;
  command.push_back(rccCommand);
  command.push_back(hasDashDashList? "--list" : "-list");

  std::string absFile = cmsys::SystemTools::GetRealPath(
                                              sf->GetFullPath());

  command.push_back(absFile);

  std::string rccStdOut;
  std::string rccStdErr;
  int retVal = 0;
  bool result = cmSystemTools::RunSingleCommand(
    command, &rccStdOut, &rccStdErr,
    &retVal, 0, cmSystemTools::OUTPUT_NONE);
  if (!result || retVal)
    {
    std::cerr << "AUTOGEN: error: Rcc list process for " << sf->GetFullPath()
              << " failed:\n" << rccStdOut << "\n" << rccStdErr << std::endl;
    return std::string();
    }

  {
  std::istringstream ostr(rccStdOut);
  std::string oline;
  while(std::getline(ostr, oline))
    {
    oline = cmQtAutoGeneratorsStripCR(oline);
    if(!oline.empty())
      {
      qrcEntries.push_back(oline);
      }
    }
  }

  {
  std::istringstream estr(rccStdErr);
  std::string eline;
  while(std::getline(estr, eline))
    {
    eline = cmQtAutoGeneratorsStripCR(eline);
    if (cmHasLiteralPrefix(eline, "RCC: Error in"))
      {
      static std::string searchString = "Cannot find file '";

      std::string::size_type pos = eline.find(searchString);
      if (pos == std::string::npos)
        {
        std::cerr << "AUTOGEN: error: Rcc lists unparsable output "
                  << eline << std::endl;
        return std::string();
        }
      pos += searchString.length();
      std::string::size_type sz = eline.size() - pos - 1;
      qrcEntries.push_back(eline.substr(pos, sz));
      }
    }
  }

  depends.insert(depends.end(), qrcEntries.begin(), qrcEntries.end());
  return cmJoin(qrcEntries, "@list_sep@");
}